

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O0

void __thiscall
DatabaseSnapshot::internal_compact
          (DatabaseSnapshot *this,Task *task,
          vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  bool bVar1;
  size_type sVar2;
  reference ppOVar3;
  DBChange *this_00;
  string *parameter;
  TaskSpec *type;
  string *in_RDX;
  DBChange *in_RSI;
  long in_RDI;
  string *in_stack_000000b0;
  DatabaseSnapshot *in_stack_000000b8;
  OnDiskDataset **dataset;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1_1;
  string dataset_name;
  OnDiskDataset *ds;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ds_names;
  TaskSpec *in_stack_00000748;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_stack_00000750;
  string *in_stack_00000758;
  path *in_stack_00000760;
  DBChange *in_stack_fffffffffffffd28;
  DatabaseName *in_stack_fffffffffffffd30;
  DBChange *this_01;
  value_type *in_stack_fffffffffffffd38;
  DBChange *in_stack_fffffffffffffd40;
  string *obj_name;
  size_type in_stack_fffffffffffffd58;
  allocator<char> *in_stack_fffffffffffffd60;
  allocator<char> *__s;
  string *in_stack_fffffffffffffd70;
  undefined1 local_279 [37];
  undefined4 local_254;
  allocator<char> local_201;
  string local_200 [32];
  string local_1e0 [24];
  OnDiskDataset *in_stack_fffffffffffffe38;
  __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_160;
  string *local_158;
  allocator<char> local_149;
  string local_148 [32];
  DatabaseName local_128;
  string local_88 [32];
  OnDiskDataset *local_68;
  OnDiskDataset **local_60;
  __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
  local_58;
  string *local_50;
  undefined4 local_34;
  string *local_18;
  DBChange *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x167d19);
  sVar2 = std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
                    ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                     local_18);
  if (sVar2 < 2) {
    local_34 = 1;
  }
  else {
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::size
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)local_18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    local_50 = local_18;
    local_58._M_current =
         (OnDiskDataset **)
         std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                   ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                    in_stack_fffffffffffffd28);
    local_60 = (OnDiskDataset **)
               std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
                         ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                          in_stack_fffffffffffffd28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar1) break;
      ppOVar3 = __gnu_cxx::
                __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                ::operator*(&local_58);
      local_68 = *ppOVar3;
      in_stack_fffffffffffffd70 = OnDiskDataset::get_name_abi_cxx11_(local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator++(&local_58);
    }
    __s = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,(char *)__s,in_stack_fffffffffffffd60);
    allocate_name(in_stack_000000b8,in_stack_000000b0);
    this_00 = (DBChange *)DatabaseName::get_filename_abi_cxx11_(&local_128);
    std::__cxx11::string::string(local_88,(string *)this_00);
    DatabaseName::~DatabaseName(in_stack_fffffffffffffd30);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    parameter = (string *)(in_RDI + 0x40);
    obj_name = local_18;
    type = Task::spec((Task *)local_10);
    OnDiskDataset::merge(in_stack_00000760,in_stack_00000758,in_stack_00000750,in_stack_00000748);
    local_158 = local_18;
    local_160._M_current =
         (OnDiskDataset **)
         std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::begin
                   ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                    in_stack_fffffffffffffd28);
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::end
              ((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
               in_stack_fffffffffffffd28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd30,
                         (__normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
                          *)in_stack_fffffffffffffd28);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator*(&local_160);
      in_stack_fffffffffffffd40 = local_10;
      OnDiskDataset::get_id_abi_cxx11_(in_stack_fffffffffffffe38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd70,(char *)__s,(allocator<char> *)this_00);
      DBChange::DBChange(this_00,(DbChangeType *)type,obj_name,parameter);
      Task::change((Task *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      DBChange::~DBChange((DBChange *)in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string(local_1e0);
      __gnu_cxx::
      __normal_iterator<const_OnDiskDataset_*const_*,_std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>_>
      ::operator++(&local_160);
    }
    local_254 = 1;
    this_01 = (DBChange *)local_279;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,(char *)__s,(allocator<char> *)this_00);
    DBChange::DBChange(this_00,(DbChangeType *)type,obj_name,parameter);
    Task::change((Task *)this_01,local_10);
    DBChange::~DBChange(this_01);
    std::__cxx11::string::~string((string *)(local_279 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_279);
    std::__cxx11::string::~string(local_88);
    local_34 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd40);
  return;
}

Assistant:

void DatabaseSnapshot::internal_compact(
    Task *task, const std::vector<const OnDiskDataset *> &datasets) const {
    std::vector<std::string> ds_names;

    // There's nothing to compact
    if (datasets.size() < 2) {
        return;
    }

    ds_names.reserve(datasets.size());
    for (const auto *ds : datasets) {
        ds_names.push_back(ds->get_name());
    }

    std::string dataset_name = allocate_name().get_filename();
    OnDiskDataset::merge(db_base, dataset_name, datasets, &task->spec());

    for (auto &dataset : datasets) {
        task->change(DBChange(DbChangeType::Drop, dataset->get_id()));
    }

    task->change(DBChange(DbChangeType::Insert, dataset_name));
}